

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O3

int __thiscall xray_re::_lzhuf::GetBit(_lzhuf *this)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  bool bVar7;
  
  bVar2 = this->getlen;
  if (bVar2 < 9) {
    uVar1 = this->getbuf;
    sVar4 = this->m_src_pos;
    bVar3 = bVar2;
    do {
      uVar6 = 0xffffffff;
      sVar5 = sVar4;
      if (sVar4 < this->m_src_limit) {
        sVar5 = sVar4 + 1;
        this->m_src_pos = sVar5;
        uVar6 = (uint)this->m_src[sVar4];
      }
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      uVar1 = uVar1 | uVar6 << (8 - bVar3 & 0x1f);
      this->getbuf = uVar1;
      bVar2 = bVar3 + 8;
      this->getlen = bVar2;
      bVar7 = bVar3 == 0;
      bVar3 = 8;
      sVar4 = sVar5;
    } while (bVar7);
  }
  else {
    uVar1 = this->getbuf;
  }
  this->getbuf = uVar1 * 2;
  this->getlen = bVar2 - 1;
  return uVar1 >> 0xf & 1;
}

Assistant:

int _lzhuf::GetBit(void)	/* get one bit */
{
	int i;

	while (getlen <= 8) {
		if ((i = getc()) < 0) i = 0;
		getbuf |= i << (8 - getlen);
		getlen += 8;
	}
	i = getbuf;
	getbuf <<= 1;
	getlen--;
	return (i >> 15) & 1;
}